

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_printf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_int64 jVar1;
  char *zIn;
  jx9_value *pObj;
  jx9_int64 nCounter;
  int nLen;
  
  nCounter = 0;
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    zIn = jx9_value_to_string(*apArg,&nLen);
    if (0 < nLen) {
      jx9InputFormat(printfConsumer,pCtx,zIn,nLen,nArg,apArg,&nCounter,0);
      jVar1 = nCounter;
      pObj = pCtx->pRet;
      jx9MemObjRelease(pObj);
      (pObj->x).iVal = jVar1;
      goto LAB_0013165d;
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
LAB_0013165d:
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_printf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_int64 nCounter = 0;
	const char *zFormat;
	int nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Format the string */
	jx9InputFormat(printfConsumer, pCtx, zFormat, nLen, nArg, apArg, (void *)&nCounter, FALSE);
	/* Return the length of the outputted string */
	jx9_result_int64(pCtx, nCounter);
	return JX9_OK;
}